

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  byte bVar1;
  uint64_t uVar2;
  int iVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  long lVar6;
  TValue *pTVar7;
  
  uVar2 = (L->glref).ptr64;
  if (errfunc == 0) {
    pTVar4 = L->top;
    lVar6 = 0;
  }
  else {
    if (errfunc < 1) {
      pTVar4 = L->top;
      pTVar5 = pTVar4 + errfunc;
    }
    else {
      pTVar4 = L->top;
      pTVar5 = (TValue *)(uVar2 + 0xf8);
      if (L->base + ((ulong)(uint)errfunc - 1) < pTVar4) {
        pTVar5 = L->base + ((ulong)(uint)errfunc - 1);
      }
    }
    lVar6 = (long)pTVar5 - (L->stack).ptr64;
  }
  bVar1 = *(byte *)(uVar2 + 0x91);
  L->top = pTVar4 + 1;
  if (0 < nargs) {
    pTVar7 = pTVar4 + -(long)nargs;
    pTVar5 = pTVar4;
    do {
      pTVar4 = pTVar5 + -1;
      *pTVar5 = pTVar5[-1];
      pTVar5 = pTVar4;
    } while (pTVar7 < pTVar4);
  }
  pTVar4->u64 = 0xffffffffffffffff;
  iVar3 = lj_vm_pcall(L,pTVar4 + 1,nresults + 1,lVar6);
  if (iVar3 != 0) {
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) & 0xf | bVar1 & 0xf0;
  }
  return iVar3;
}

Assistant:

LUA_API int lua_pcall(lua_State *L, int nargs, int nresults, int errfunc)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  ptrdiff_t ef;
  int status;
  lj_checkapi(L->status == LUA_OK || L->status == LUA_ERRERR,
	      "thread called in wrong state %d", L->status);
  lj_checkapi_slot(nargs+1);
  if (errfunc == 0) {
    ef = 0;
  } else {
    cTValue *o = index2adr_stack(L, errfunc);
    ef = savestack(L, o);
  }
  status = lj_vm_pcall(L, api_call_base(L, nargs), nresults+1, ef);
  if (status) hook_restore(g, oldh);
  return status;
}